

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freecell.c
# Opt level: O3

_Bool freecell_isWon(Board *board)

{
  byte bVar1;
  Spot *pSVar2;
  byte bVar3;
  _Bool _Var4;
  
  _Var4 = false;
  pSVar2 = board_spotGet(board,FOUNDATION,'\0');
  if (pSVar2->cardsCount == '\r') {
    bVar1 = 0;
    do {
      bVar3 = bVar1;
      if (bVar3 == 3) break;
      pSVar2 = board_spotGet(board,FOUNDATION,bVar3 + 1);
      bVar1 = bVar3 + 1;
    } while (pSVar2->cardsCount == '\r');
    _Var4 = 2 < bVar3;
  }
  return _Var4;
}

Assistant:

bool freecell_isWon(Board * board)
{
	unsigned char i;
	Spot * foundation;
	for(i=0;i<4;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}